

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O1

ogt_vox_transform *
ogt_vox_sample_instance_transform_global
          (ogt_vox_transform *__return_storage_ptr__,ogt_vox_instance *instance,uint32_t frame_index
          ,ogt_vox_scene *scene)

{
  uint32_t num_keyframes;
  ogt_vox_transform final_transform;
  ogt_vox_transform local_a8;
  ogt_vox_transform local_60;
  
  num_keyframes = (instance->transform_anim).num_keyframes;
  if (num_keyframes == 0) {
    local_a8.m00 = (instance->transform).m00;
    local_a8.m01 = (instance->transform).m01;
    local_a8.m02 = (instance->transform).m02;
    local_a8.m03 = (instance->transform).m03;
    local_a8.m10 = (instance->transform).m10;
    local_a8.m11 = (instance->transform).m11;
    local_a8.m12 = (instance->transform).m12;
    local_a8.m13 = (instance->transform).m13;
    local_a8.m20 = (instance->transform).m20;
    local_a8.m21 = (instance->transform).m21;
    local_a8.m22 = (instance->transform).m22;
    local_a8.m23 = (instance->transform).m23;
    local_a8.m30 = (instance->transform).m30;
    local_a8.m31 = (instance->transform).m31;
    local_a8.m32 = (instance->transform).m32;
    local_a8.m33 = (instance->transform).m33;
  }
  else {
    sample_keyframe_transform
              (&local_a8,(instance->transform_anim).keyframes,num_keyframes,
               (instance->transform_anim).loop,frame_index);
  }
  if ((ulong)instance->group_index == 0xffffffff) {
    __return_storage_ptr__->m30 = local_a8.m30;
    __return_storage_ptr__->m31 = local_a8.m31;
    __return_storage_ptr__->m32 = local_a8.m32;
    __return_storage_ptr__->m33 = local_a8.m33;
    __return_storage_ptr__->m20 = local_a8.m20;
    __return_storage_ptr__->m21 = local_a8.m21;
    __return_storage_ptr__->m22 = local_a8.m22;
    __return_storage_ptr__->m23 = local_a8.m23;
    __return_storage_ptr__->m10 = local_a8.m10;
    __return_storage_ptr__->m11 = local_a8.m11;
    __return_storage_ptr__->m12 = local_a8.m12;
    __return_storage_ptr__->m13 = local_a8.m13;
    __return_storage_ptr__->m00 = local_a8.m00;
    __return_storage_ptr__->m01 = local_a8.m01;
    __return_storage_ptr__->m02 = local_a8.m02;
    __return_storage_ptr__->m03 = local_a8.m03;
  }
  else {
    ogt_vox_sample_group_transform_global
              (&local_60,scene->groups + instance->group_index,frame_index,scene);
    ogt_vox_transform_multiply(__return_storage_ptr__,&local_a8,&local_60);
  }
  return __return_storage_ptr__;
}

Assistant:

ogt_vox_transform ogt_vox_sample_instance_transform_global(const ogt_vox_instance* instance, uint32_t frame_index, const ogt_vox_scene* scene)
    {
        ogt_vox_transform final_transform = ogt_vox_sample_instance_transform_local(instance, frame_index);
        uint32_t group_index = instance->group_index;
        if (group_index == k_invalid_group_index)
            return final_transform;
        const ogt_vox_group* group = &scene->groups[group_index];
        return ogt_vox_transform_multiply(final_transform, ogt_vox_sample_group_transform_global(group, frame_index, scene));
    }